

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  int iVar2;
  Descriptor *type;
  Message *pMVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  bool bVar5;
  char *pcVar6;
  ErrorPrinter error_collector;
  Parser parser;
  FileOutputStream out;
  FileInputStream in;
  DynamicMessageFactory dynamic_factory;
  MessageLite *this_00;
  
  type = DescriptorPool::FindMessageTypeByName(pool,&this->codec_type_);
  if (type == (Descriptor *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar4 = std::operator<<(poVar4,(string *)&this->codec_type_);
    std::endl<char,std::char_traits<char>>(poVar4);
    return false;
  }
  DynamicMessageFactory::DynamicMessageFactory(&dynamic_factory,pool);
  pMVar3 = DynamicMessageFactory::GetPrototype(&dynamic_factory,type);
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
  this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  io::FileInputStream::FileInputStream(&in,0,-1);
  io::FileOutputStream::FileOutputStream(&out,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    error_collector.format_ = this->error_format_;
    error_collector.super_MultiFileErrorCollector._vptr_MultiFileErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00477588;
    error_collector.super_ErrorCollector._vptr_ErrorCollector = (_func_int **)&DAT_004775d8;
    error_collector.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00477608;
    error_collector.tree_ = (DiskSourceTree *)0x0;
    error_collector.found_errors_ = false;
    TextFormat::Parser::Parser(&parser);
    parser.error_collector_ = &error_collector.super_ErrorCollector;
    parser.allow_partial_ = true;
    bVar1 = TextFormat::Parser::Parse(&parser,&in.super_ZeroCopyInputStream,(Message *)this_00);
    if (bVar1) {
      TextFormat::Parser::~Parser(&parser);
      ErrorPrinter::~ErrorPrinter(&error_collector);
LAB_0026d0eb:
      iVar2 = (*this_00->_vptr_MessageLite[8])(this_00);
      if ((char)iVar2 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "warning:  Input message is missing required fields:  ");
        (*this_00->_vptr_MessageLite[9])(&error_collector,this_00);
        poVar4 = std::operator<<(poVar4,(string *)&error_collector);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&error_collector);
      }
      if (this->mode_ == MODE_ENCODE) {
        bVar1 = MessageLite::SerializePartialToZeroCopyStream
                          (this_00,&out.super_ZeroCopyOutputStream);
      }
      else {
        bVar1 = TextFormat::Print((Message *)this_00,&out.super_ZeroCopyOutputStream);
      }
      bVar5 = true;
      if (bVar1 != false) goto LAB_0026d1bf;
      pcVar6 = "output: I/O error.";
      goto LAB_0026d1a9;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
    std::endl<char,std::char_traits<char>>(poVar4);
    TextFormat::Parser::~Parser(&parser);
    ErrorPrinter::~ErrorPrinter(&error_collector);
  }
  else {
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream(this_00,&in.super_ZeroCopyInputStream);
    if (bVar1) goto LAB_0026d0eb;
    pcVar6 = "Failed to parse input.";
LAB_0026d1a9:
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  bVar5 = false;
LAB_0026d1bf:
  io::FileOutputStream::~FileOutputStream(&out);
  io::FileInputStream::~FileInputStream(&in);
  if (this_00 != (MessageLite *)0x0) {
    (*this_00->_vptr_MessageLite[1])(this_00);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&dynamic_factory);
  return bVar5;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == NULL) {
    std::cerr << "Type not defined: " << codec_type_ << std::endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  std::unique_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    std::cerr << "warning:  Input message is missing required fields:  "
              << message->InitializationErrorString() << std::endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    if (!message->SerializePartialToZeroCopyStream(&out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  }

  return true;
}